

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_create(secp256k1_context *ctx,uchar *ell64,uchar *seckey32,uchar *auxrnd32)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  int ret;
  secp256k1_scalar seckey_scalar;
  secp256k1_sha256 hash;
  secp256k1_fe t;
  secp256k1_ge p;
  secp256k1_sha256 *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  secp256k1_fe *in_stack_fffffffffffffeb8;
  secp256k1_sha256 *in_stack_fffffffffffffec0;
  undefined1 local_128 [112];
  uchar *in_stack_ffffffffffffff48;
  secp256k1_ge *in_stack_ffffffffffffff50;
  secp256k1_scalar *in_stack_ffffffffffffff58;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff60;
  undefined1 local_90 [104];
  long local_28;
  long local_20;
  void *local_18;
  secp256k1_context *local_10;
  int local_4;
  
  if (in_RDI == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/ellswift/main_impl.h"
            ,0x1cb,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (char *)in_stack_fffffffffffffea8);
    local_4 = 0;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RSI,0,0x40);
    iVar1 = secp256k1_ecmult_gen_context_is_built(&local_10->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                 ,(char *)in_stack_fffffffffffffea8);
      local_4 = 0;
    }
    else if (local_20 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                 ,(char *)in_stack_fffffffffffffea8);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_ec_pubkey_create_helper
                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      secp256k1_declassify(local_10,local_90,0x68);
      secp256k1_fe_normalize_var((secp256k1_fe *)0x109a2a);
      secp256k1_fe_normalize_var((secp256k1_fe *)0x109a3b);
      secp256k1_ellswift_sha256_init_create((secp256k1_sha256 *)0x109a45);
      secp256k1_sha256_write
                (in_stack_fffffffffffffec0,(uchar *)in_stack_fffffffffffffeb8,
                 CONCAT44(iVar1,in_stack_fffffffffffffeb0));
      secp256k1_sha256_write
                (in_stack_fffffffffffffec0,(uchar *)in_stack_fffffffffffffeb8,
                 CONCAT44(iVar1,in_stack_fffffffffffffeb0));
      secp256k1_declassify(local_10,local_128,0x68);
      if (local_28 != 0) {
        secp256k1_sha256_write
                  (in_stack_fffffffffffffec0,(uchar *)in_stack_fffffffffffffeb8,
                   CONCAT44(iVar1,in_stack_fffffffffffffeb0));
      }
      secp256k1_ellswift_elligatorswift_var
                ((uchar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (secp256k1_ge *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
                );
      secp256k1_fe_get_b32
                ((uchar *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),
                 (secp256k1_fe *)in_stack_fffffffffffffea8);
      secp256k1_memczero(local_18,0x40,(uint)((iVar1 != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)0x109b11);
      local_4 = iVar1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ellswift_create(const secp256k1_context *ctx, unsigned char *ell64, const unsigned char *seckey32, const unsigned char *auxrnd32) {
    secp256k1_ge p;
    secp256k1_fe t;
    secp256k1_sha256 hash;
    secp256k1_scalar seckey_scalar;
    int ret;
    static const unsigned char zero32[32] = {0};

    /* Sanity check inputs. */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    memset(ell64, 0, 64);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    /* Compute (affine) public key */
    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey32);
    secp256k1_declassify(ctx, &p, sizeof(p)); /* not constant time in produced pubkey */
    secp256k1_fe_normalize_var(&p.x);
    secp256k1_fe_normalize_var(&p.y);

    /* Set up hasher state. The used RNG is H(privkey || "\x00"*32 [|| auxrnd32] || cnt++),
     * using BIP340 tagged hash with tag "secp256k1_ellswift_create". */
    secp256k1_ellswift_sha256_init_create(&hash);
    secp256k1_sha256_write(&hash, seckey32, 32);
    secp256k1_sha256_write(&hash, zero32, sizeof(zero32));
    secp256k1_declassify(ctx, &hash, sizeof(hash)); /* private key is hashed now */
    if (auxrnd32) secp256k1_sha256_write(&hash, auxrnd32, 32);

    /* Compute ElligatorSwift encoding and construct output. */
    secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
    secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */

    secp256k1_memczero(ell64, 64, !ret);
    secp256k1_scalar_clear(&seckey_scalar);

    return ret;
}